

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

int __thiscall
gmath::RationalTangentialDistortion::clone
          (RationalTangentialDistortion *this,__fn *__fn,void *__child_stack,int __flags,void *__arg
          ,...)

{
  RationalTangentialDistortion *this_00;
  long lVar1;
  
  this_00 = (RationalTangentialDistortion *)operator_new(0x48);
  RationalTangentialDistortion(this_00);
  for (lVar1 = 1; lVar1 != 9; lVar1 = lVar1 + 1) {
    this_00->kd[lVar1 + -1] = this->kd[lVar1 + -1];
  }
  return (int)this_00;
}

Assistant:

Distortion *RationalTangentialDistortion::clone() const
{
  RationalTangentialDistortion *ret=new RationalTangentialDistortion();

  for (int i=0; i<8; i++)
  {
    ret->kd[i]=kd[i];
  }

  return ret;
}